

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.hpp
# Opt level: O1

void __thiscall
TasGrid::GridLocalPolynomial::diffBasisSupported<(TasGrid::RuleLocal::erule)1>
          (GridLocalPolynomial *this,int *point,double *x,double *diff_values,bool *isSupported)

{
  uint uVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  bool isDimSupported;
  bool local_39;
  double *local_38;
  
  *isSupported = false;
  lVar3 = (long)(this->super_BaseCanonicalGrid).num_dimensions;
  if (0 < lVar3) {
    lVar4 = 0;
    do {
      diff_values[lVar4] = 1.0;
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
  }
  local_39 = false;
  local_38 = x;
  if (0 < (this->super_BaseCanonicalGrid).num_dimensions) {
    uVar6 = 1;
    lVar3 = 0;
    do {
      dVar7 = RuleLocal::evalSupport<(TasGrid::RuleLocal::erule)1>
                        (this->order,point[lVar3],local_38[lVar3],&local_39);
      bVar2 = *isSupported;
      if (local_39 != false) {
        bVar2 = true;
      }
      *isSupported = bVar2;
      if (lVar3 != 0) {
        lVar4 = 0;
        do {
          diff_values[lVar4] = diff_values[lVar4] * dVar7;
          lVar4 = lVar4 + 1;
        } while (lVar3 != lVar4);
      }
      lVar3 = lVar3 + 1;
      uVar1 = (this->super_BaseCanonicalGrid).num_dimensions;
      if (lVar3 < (int)uVar1) {
        uVar5 = uVar6;
        do {
          diff_values[uVar5] = diff_values[uVar5] * dVar7;
          uVar5 = uVar5 + 1;
        } while (uVar1 != uVar5);
      }
      uVar6 = uVar6 + 1;
    } while (lVar3 < (this->super_BaseCanonicalGrid).num_dimensions);
  }
  if (0 < (this->super_BaseCanonicalGrid).num_dimensions) {
    lVar3 = 0;
    do {
      dVar7 = RuleLocal::diffSupport<(TasGrid::RuleLocal::erule)1>
                        (this->order,point[lVar3],local_38[lVar3],&local_39);
      diff_values[lVar3] = dVar7 * diff_values[lVar3];
      bVar2 = *isSupported;
      if (local_39 != false) {
        bVar2 = true;
      }
      *isSupported = bVar2;
      lVar3 = lVar3 + 1;
    } while (lVar3 < (this->super_BaseCanonicalGrid).num_dimensions);
  }
  return;
}

Assistant:

void diffBasisSupported(const int point[], const double x[], double diff_values[], bool &isSupported) const{
        isSupported = false;
        for(int i=0; i<num_dimensions; i++) diff_values[i] = 1.0;
        bool isDimSupported = false;
        for(int k=0; k<num_dimensions; k++) {
            double fval = RuleLocal::evalSupport<effrule>(order, point[k], x[k], isDimSupported);
            isSupported = isDimSupported or isSupported;
            for(int j=0; j<k; j++) diff_values[j] *= fval;
            for(int j=k+1; j<num_dimensions; j++) diff_values[j] *= fval;
        }
        for (int k=0; k<num_dimensions; k++) {
            diff_values[k] *= RuleLocal::diffSupport<effrule>(order, point[k], x[k], isDimSupported);
            isSupported = isDimSupported or isSupported;
        }
    }